

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O1

GCObject **
sweepgen(lua_State *L,global_State *g,GCObject **p,GCObject *limit,GCObject **pfirstold1)

{
  byte bVar1;
  byte bVar2;
  GCObject *o;
  
  o = *p;
  if (o != limit) {
    bVar1 = g->currentwhite;
    do {
      bVar2 = o->marked;
      if ((bVar2 & 0x18) == 0) {
        p = &o->next;
        if ((bVar2 & 7) == 0) {
          o->marked = bVar2 & 0xc0 | bVar1 & 0x18 | 1;
        }
        else {
          o->marked = bVar2 & 0xe0 | "\x01\x03\x03\x04\x04\x05\x06"[bVar2 & 7];
          if (((bVar2 & 7) < 3) && (*pfirstold1 == (GCObject *)0x0)) {
            *pfirstold1 = o;
          }
        }
      }
      else {
        if (((bVar2 & 6) != 0) || (((g->currentwhite ^ 0x18) & bVar2) == 0)) {
          __assert_fail("!(((curr)->marked & 7) > 1) && (((curr)->marked) & (((g)->currentwhite ^ ((1<<(3)) | (1<<(4))))))"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                        ,0x4c4,
                        "GCObject **sweepgen(lua_State *, global_State *, GCObject **, GCObject *, GCObject **)"
                       );
        }
        ((GCObject *)p)->next = o->next;
        freeobj(L,o);
      }
      o = ((GCObject *)p)->next;
    } while (o != limit);
  }
  return &((GCObject *)p)->next;
}

Assistant:

static GCObject **sweepgen (lua_State *L, global_State *g, GCObject **p,
                            GCObject *limit, GCObject **pfirstold1) {
  static const lu_byte nextage[] = {
    G_SURVIVAL,  /* from G_NEW */
    G_OLD1,      /* from G_SURVIVAL */
    G_OLD1,      /* from G_OLD0 */
    G_OLD,       /* from G_OLD1 */
    G_OLD,       /* from G_OLD (do not change) */
    G_TOUCHED1,  /* from G_TOUCHED1 (do not change) */
    G_TOUCHED2   /* from G_TOUCHED2 (do not change) */
  };
  int white = luaC_white(g);
  GCObject *curr;
  while ((curr = *p) != limit) {
    if (iswhite(curr)) {  /* is 'curr' dead? */
      lua_assert(!isold(curr) && isdead(g, curr));
      *p = curr->next;  /* remove 'curr' from list */
      freeobj(L, curr);  /* erase 'curr' */
    }
    else {  /* correct mark and age */
      if (getage(curr) == G_NEW) {  /* new objects go back to white */
        int marked = curr->marked & ~maskgcbits;  /* erase GC bits */
        curr->marked = cast_byte(marked | G_SURVIVAL | white);
      }
      else {  /* all other objects will be old, and so keep their color */
        setage(curr, nextage[getage(curr)]);
        if (getage(curr) == G_OLD1 && *pfirstold1 == NULL)
          *pfirstold1 = curr;  /* first OLD1 object in the list */
      }
      p = &curr->next;  /* go to next element */
    }
  }
  return p;
}